

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Op __thiscall spv::Builder::getMostBasicTypeClass(Builder *this,Id typeId)

{
  Op OVar1;
  Instruction *pIVar2;
  ulong uVar3;
  uint *puVar4;
  
  uVar3 = (ulong)typeId;
  do {
    pIVar2 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3];
    OVar1 = pIVar2->opCode;
    uVar3 = (ulong)OVar1;
    if (0x20 < uVar3) {
      return OVar1;
    }
    if ((0x31800000UL >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 != 0x20) {
        return OVar1;
      }
      if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data & 2) == 0) goto LAB_0045b3d2;
      puVar4 = (uint *)(*(long *)&(pIVar2->operands).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data + 4);
    }
    else {
      if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data & 1) == 0) {
LAB_0045b3d2:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      puVar4 = (pIVar2->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar3 = (ulong)*puVar4;
  } while( true );
}

Assistant:

Op Builder::getMostBasicTypeClass(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    Op typeClass = instr->getOpCode();
    switch (typeClass)
    {
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return getMostBasicTypeClass(instr->getIdOperand(0));
    case OpTypePointer:
        return getMostBasicTypeClass(instr->getIdOperand(1));
    default:
        return typeClass;
    }
}